

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_validate(lyd_node **node,int options,void *var_arg,...)

{
  char in_AL;
  int iVar1;
  ly_ctx *in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  ly_ctx *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  ly_ctx *local_48;
  ly_ctx *ctx;
  lyd_difflist **diff;
  lyd_node *data_tree;
  lyd_node *iter;
  void *var_arg_local;
  int options_local;
  lyd_node **node_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ctx = (ly_ctx *)0x0;
  local_48 = (ly_ctx *)0x0;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (node == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate");
    node_local._4_4_ = 1;
  }
  else {
    iVar1 = lyp_data_check_options((ly_ctx *)0x0,options,"lyd_validate");
    if (iVar1 == 0) {
      diff = (lyd_difflist **)*node;
      if ((((options & 0x10000ffU) == 0) || ((options & 0xfU) != 0)) && (*node == (lyd_node *)0x0))
      {
        if (var_arg == (void *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (struct ly_ctx *ctx).","lyd_validate");
          return 1;
        }
        var_arg_local._4_4_ = options & 0xffffefff;
        local_48 = (ly_ctx *)var_arg;
      }
      else {
        var_arg_local._4_4_ = options;
        if ((options & 0x70U) == 0) {
          if ((((options & 0x1000000U) != 0) && (*node != (lyd_node *)0x0)) &&
             (((*node)->prev->next != (lyd_node *)0x0 || ((*node)->next != (lyd_node *)0x0)))) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                   "%s: invalid variable parameter (struct lyd_node *node).","lyd_validate");
            return 1;
          }
        }
        else {
          if ((options & 0x1000U) != 0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                   "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
                   ,"lyd_validate");
            return 1;
          }
          if (*node == (lyd_node *)0x0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate");
            return 1;
          }
          diff = (lyd_difflist **)var_arg;
          if (var_arg != (void *)0x0) {
            data_tree = (lyd_node *)var_arg;
            if ((options & 0x8000U) != 0) {
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                     "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
                     ,"lyd_validate");
              return 1;
            }
            for (; data_tree != (lyd_node *)0x0; data_tree = data_tree->next) {
              if (data_tree->parent != (lyd_node *)0x0) {
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                       "%s: invalid variable parameter (const struct lyd_node *data_tree).",
                       "lyd_validate");
                return 1;
              }
            }
            while (diff[4][1].type != (LYD_DIFFTYPE *)0x0) {
              diff = (lyd_difflist **)diff[4];
            }
          }
        }
      }
      if ((var_arg_local._4_4_ & 0x40000) != 0) {
        ap[0].overflow_arg_area = local_118;
        ap[0]._0_8_ = &stack0x00000008;
        local_64 = 0x30;
        local_68 = 0x20;
        ctx = local_100;
        if (local_100 == (ly_ctx *)0x0) {
          ly_log(local_48,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (struct lyd_difflist **).","lyd_validate");
          return 1;
        }
      }
      if (*node != (lyd_node *)0x0) {
        if (local_48 == (ly_ctx *)0x0) {
          local_48 = (*node)->schema->module->ctx;
        }
        if ((var_arg_local._4_4_ & 0x1000) == 0) {
          while ((*node)->prev->next != (lyd_node *)0x0) {
            *node = (*node)->prev;
          }
        }
      }
      node_local._4_4_ =
           _lyd_validate(node,(lyd_node *)diff,local_48,(lys_module **)0x0,0,(lyd_difflist **)ctx,
                         var_arg_local._4_4_);
    }
    else {
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

static int
_lyd_validate(struct lyd_node **node, struct lyd_node *data_tree, struct ly_ctx *ctx, const struct lys_module **modules,
              int mod_count, struct lyd_difflist **diff, int options)
{
    struct lyd_node *root, *next1, *next2, *iter, *act_notif = NULL;
    int ret = EXIT_FAILURE;
    unsigned int i;
    struct unres_data *unres = NULL;
    const struct lys_module *yanglib_mod;

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(NULL), EXIT_FAILURE);

    if (diff) {
        unres->store_diff = 1;
        unres->diff = lyd_diff_init_difflist(ctx, &unres->diff_size);
    }

    if ((options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) && *node && ((*node)->schema->nodetype != LYS_RPC)) {
        options |= LYD_OPT_ACT_NOTIF;
    }
    if ((options & (LYD_OPT_NOTIF | LYD_OPT_NOTIF_FILTER)) && *node && ((*node)->schema->nodetype != LYS_NOTIF)) {
        options |= LYD_OPT_ACT_NOTIF;
    }

    LY_TREE_FOR_SAFE(*node, next1, root) {
        if (modules) {
            for (i = 0; i < (unsigned)mod_count; ++i) {
                if (lyd_node_module(root) == modules[i]) {
                    break;
                }
            }
            if (i == (unsigned)mod_count) {
                /* skip data that should not be validated */
                continue;
            }
        }

        LY_TREE_DFS_BEGIN(root, next2, iter) {
            if (iter->parent && (iter->schema->nodetype & (LYS_ACTION | LYS_NOTIF))) {
                if (!(options & LYD_OPT_ACT_NOTIF) || act_notif) {
                    LOGVAL(ctx, LYE_INELEM, LY_VLOG_LYD, iter, iter->schema->name);
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Unexpected %s node \"%s\".",
                           (options & LYD_OPT_RPC ? "action" : "notification"), iter->schema->name);
                    goto cleanup;
                }
                act_notif = iter;
            }

            if (lyv_data_context(iter, options, unres) || lyv_data_content(iter, options, unres)) {
                goto cleanup;
            }

            /* empty non-default, non-presence container without attributes, make it default */
            if (!iter->dflt && (iter->schema->nodetype == LYS_CONTAINER) && !iter->child
                        && !((struct lys_node_container *)iter->schema)->presence && !iter->attr) {
                iter->dflt = 1;
            }

            LY_TREE_DFS_END(root, next2, iter);
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            break;
        }

    }

    if (options & LYD_OPT_ACT_NOTIF) {
        if (!act_notif) {
            LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, *node, (options & LYD_OPT_RPC ? "action" : "notification"), (*node)->schema->name);
            goto cleanup;
        }
        options &= ~LYD_OPT_ACT_NOTIF;
    }

    if (*node) {
        /* check for uniqueness of top-level lists/leaflists because
         * only the inner instances were tested in lyv_data_content() */
        yanglib_mod = ly_ctx_get_module(ctx ? ctx : (*node)->schema->module->ctx, "ietf-yang-library", NULL, 1);
        LY_TREE_FOR(*node, root) {
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && yanglib_mod && (root->schema->module == yanglib_mod)) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }

            if (!(root->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(root->validity & LYD_VAL_DUP)) {
                continue;
            }

            if (options & LYD_OPT_TRUSTED) {
                /* just clear the flag */
                root->validity &= ~LYD_VAL_DUP;
                continue;
            }

            if (lyv_data_dup(root, *node)) {
                goto cleanup;
            }
        }
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!(*node)) {
            (*node) = ly_ctx_info(ctx);
        } else if (lyd_merge((*node), ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto cleanup;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(node, options, ctx, modules, mod_count, data_tree, act_notif, unres, 1)) {
        goto cleanup;
    }
    if (act_notif) {
        if (lyd_check_mandatory_tree(act_notif, ctx, modules, mod_count, options)) {
            goto cleanup;
        }
    } else {
        if (lyd_check_mandatory_tree(*node, ctx, modules, mod_count, options)) {
            goto cleanup;
        }
    }

    /* consolidate diff if created */
    if (diff) {
        assert(unres->store_diff);

        for (i = 0; i < unres->diff_idx; ++i) {
            if (unres->diff->type[i] == LYD_DIFF_CREATED) {
                if (unres->diff->second[i]->parent) {
                    unres->diff->first[i] = (struct lyd_node *)lyd_path(unres->diff->second[i]->parent);
                }
                unres->diff->second[i] = lyd_dup(unres->diff->second[i], LYD_DUP_OPT_RECURSIVE);
            }
        }

        *diff = unres->diff;
        unres->diff = 0;
        unres->diff_idx = 0;
    }

    ret = EXIT_SUCCESS;

cleanup:
    if (unres) {
        free(unres->node);
        free(unres->type);
        for (i = 0; i < unres->diff_idx; ++i) {
            if (unres->diff->type[i] == LYD_DIFF_DELETED) {
                lyd_free_withsiblings(unres->diff->first[i]);
                free(unres->diff->second[i]);
            }
        }
        lyd_free_diff(unres->diff);
        free(unres);
    }

    return ret;
}